

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.h
# Opt level: O2

bool match_literal_fast(char c,StreamCursor *cursor)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = StreamCursor::eof(cursor);
  if ((!bVar1) && (cVar2 = StreamCursor::current(cursor), cVar2 == c)) {
    StreamCursor::advance(cursor,1);
    return true;
  }
  return false;
}

Assistant:

inline bool match_literal_fast(char c, StreamCursor& cursor)
{
    if (cursor.eof())
        return false;

    if (c == cursor.current()) {
        cursor.advance(1);
        return true;
    }

    return false;
}